

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O2

UINT8 device_start_x1_010(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  uint uVar2;
  DEV_DATA chip;
  uint uVar3;
  
  chip.chipInf = calloc(1,0x20b0);
  if ((DEV_DATA *)chip.chipInf == (DEV_DATA *)0x0) {
    return 0xff;
  }
  uVar2 = cfg->clock;
  *(uint *)((long)chip.chipInf + 0x209c) = uVar2;
  uVar2 = uVar2 >> 9;
  *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0x18))->chipInf = uVar2;
  if (cfg->srMode == '\x02') {
    uVar3 = cfg->smplRate;
    if (uVar3 <= uVar2) goto LAB_001627ca;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_001627ca;
    uVar3 = cfg->smplRate;
  }
  *(uint *)&((DEV_DATA *)((long)chip.chipInf + 0x18))->chipInf = uVar3;
LAB_001627ca:
  x1_010_set_mute_mask(chip.chipInf,0);
  *(void **)chip.chipInf = chip.chipInf;
  UVar1 = *(UINT32 *)((long)chip.chipInf + 0x18);
  retDevInf->dataPtr = (DEV_DATA *)chip.chipInf;
  retDevInf->sampleRate = UVar1;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_x1_010(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	x1_010_state *info;

	info = (x1_010_state *)calloc(1, sizeof(x1_010_state));
	if (info == NULL)
		return 0xFF;

	info->base_clock    = cfg->clock;
	info->rate          = info->base_clock / 512;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->rate, cfg->smplRate);

	info->ROMSize       = 0x00;
	info->rom           = NULL;

	/* Print some more debug info */
	//LOG_SOUND(("masterclock = %d rate = %d\n", info->base_clock, info->rate ));

	x1_010_set_mute_mask(info, 0x0000);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);

	return 0x00;
}